

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

void LargeIntRegMultiply<unsigned_long,_int>::
     RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (uint64_t *a,int32_t b,uint64_t *pRet)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  if ((*a == 0 || -1 < b) &&
     (auVar1._8_8_ = 0, auVar1._0_8_ = *a, auVar2._8_8_ = 0, auVar2._0_8_ = (long)b,
     SUB168(auVar1 * auVar2,8) == 0)) {
    *pRet = SUB168(auVar1 * auVar2,0);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14_MULTIPLY static void RegMultiplyThrow( const std::uint64_t& a, std::int32_t b, std::uint64_t* pRet ) SAFEINT_CPP_THROW
    {
        if( b < 0 && a != 0 )
            E::SafeIntOnOverflow();

#if SAFEINT_USE_INTRINSICS || SAFEINT_HAS_INT128
        if( !MultiplyUint64( a, (std::uint64_t)b, pRet ) )
            E::SafeIntOnOverflow();
#else
        LargeIntRegMultiply< std::uint64_t, std::uint32_t >::template RegMultiplyThrow< E >( a, (std::uint32_t)b, pRet );
#endif
    }